

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O1

int Min_SopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  bool bVar1;
  Min_Cube_t *pMVar2;
  Min_Cube_t *pMVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Min_Cube_t *pMVar7;
  uint uVar8;
  ulong uVar9;
  Min_Cube_t *pMVar10;
  Min_Cube_t *pMVar11;
  Min_Cube_t **ppMVar12;
  
  ppMVar12 = p->ppStore;
  uVar6 = *(uint *)&pCube->field_0x8;
  uVar4 = uVar6 >> 0x16;
  pMVar7 = ppMVar12[uVar4];
  if (pMVar7 != (Min_Cube_t *)0x0) {
    uVar8 = uVar6 >> 10 & 0xfff;
    if (uVar8 == 0) {
LAB_0044c012:
      Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pCube);
      return 0;
    }
    do {
      uVar9 = 0;
      while (pCube->uData[uVar9] == pMVar7->uData[uVar9]) {
        uVar9 = uVar9 + 1;
        if (uVar8 == uVar9) goto LAB_0044c012;
      }
      pMVar7 = pMVar7->pNext;
    } while (pMVar7 != (Min_Cube_t *)0x0);
  }
  if (0x3fffff < uVar6) {
    uVar9 = 0;
    do {
      pMVar7 = ppMVar12[uVar9];
      if (pMVar7 != (Min_Cube_t *)0x0) {
        do {
          if (pMVar7 != p->pBubble) {
            uVar6 = *(uint *)&pMVar7->field_0x8 >> 10 & 0xfff;
            if (uVar6 == 0) goto LAB_0044c012;
            uVar5 = 0;
            while ((pCube->uData[uVar5] & ~pMVar7->uData[uVar5]) == 0) {
              uVar5 = uVar5 + 1;
              if (uVar6 == uVar5) goto LAB_0044c012;
            }
          }
          pMVar7 = pMVar7->pNext;
        } while (pMVar7 != (Min_Cube_t *)0x0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar4);
  }
  ppMVar12 = ppMVar12 + uVar4;
  pMVar7 = *ppMVar12;
  if (pMVar7 != (Min_Cube_t *)0x0) {
    uVar6 = *(uint *)&pCube->field_0x8 >> 10 & 0xfff;
    pMVar2 = pMVar7;
    pMVar10 = (Min_Cube_t *)ppMVar12;
    do {
      pMVar11 = pMVar2;
      if (uVar6 == 0) {
LAB_0044c02e:
        putchar(10);
        Min_CubeWrite(_stdout,pCube);
        Min_CubeWrite(_stdout,pMVar7);
        puts("Error: Min_CubesDistOne() looks at two equal cubes!");
LAB_0044c063:
        *ppMVar12 = pMVar7->pNext;
        uVar6 = *(uint *)&pCube->field_0x8;
        uVar4 = uVar6 >> 10 & 0xfff;
        if (uVar4 != 0) {
          uVar9 = 0;
          do {
            pCube->uData[uVar9] = pCube->uData[uVar9] | pMVar7->uData[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar4 != uVar9);
        }
        *(uint *)&pCube->field_0x8 = uVar6 - 0x400000;
        Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pMVar7);
        p->nCubes = p->nCubes + -1;
        return 1;
      }
      uVar9 = 0;
      bVar1 = false;
      while( true ) {
        uVar4 = *(uint *)((long)pMVar11->uData + uVar9 * 4);
        if ((pCube->uData[uVar9] != uVar4) &&
           ((bVar1 || (uVar4 = uVar4 ^ pCube->uData[uVar9],
                      uVar4 = (uVar4 >> 1 | uVar4) & 0x55555555, bVar1 = true,
                      (uVar4 & uVar4 - 1) != 0)))) break;
        uVar9 = uVar9 + 1;
        if (uVar6 == uVar9) {
          ppMVar12 = &pMVar10->pNext;
          pMVar7 = pMVar11;
          if (!bVar1) goto LAB_0044c02e;
          goto LAB_0044c063;
        }
      }
      pMVar2 = pMVar11->pNext;
      pMVar10 = pMVar11;
    } while (pMVar11->pNext != (Min_Cube_t *)0x0);
  }
  uVar6 = *(uint *)&pCube->field_0x8;
  if (uVar6 >> 0x16 < (uVar6 & 0x3ff)) {
    uVar9 = (ulong)(uVar6 >> 0x16);
    do {
      pMVar7 = p->ppStore[uVar9 + 1];
      if (pMVar7 != (Min_Cube_t *)0x0) {
        pMVar2 = pMVar7->pNext;
        pMVar10 = (Min_Cube_t *)(p->ppStore + uVar9 + 1);
        do {
          pMVar3 = pMVar2;
          pMVar11 = pMVar7;
          if (pMVar7 != p->pBubble) {
            uVar6 = *(uint *)&pCube->field_0x8 >> 10 & 0xfff;
            if (uVar6 != 0) {
              uVar5 = 0;
              do {
                if ((pMVar7->uData[uVar5] & ~pCube->uData[uVar5]) != 0) goto LAB_0044bf76;
                uVar5 = uVar5 + 1;
              } while (uVar6 != uVar5);
            }
            pMVar10->pNext = pMVar7->pNext;
            Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pMVar7);
            p->nCubes = p->nCubes + -1;
            pMVar11 = pMVar10;
          }
LAB_0044bf76:
          if (pMVar3 == (Min_Cube_t *)0x0) break;
          pMVar2 = pMVar3->pNext;
          pMVar7 = pMVar3;
          pMVar10 = pMVar11;
        } while( true );
      }
      uVar9 = uVar9 + 1;
      uVar6 = *(uint *)&pCube->field_0x8;
    } while (uVar9 < (uVar6 & 0x3ff));
  }
  ppMVar12 = p->ppStore;
  pCube->pNext = ppMVar12[uVar6 >> 0x16];
  ppMVar12[uVar6 >> 0x16] = pCube;
  p->nCubes = p->nCubes + 1;
  return 0;
}

Assistant:

int Min_SopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, * pThis2, ** ppPrev;
    int i;
    // try to find the identical cube
    Min_CoverForEachCube( p->ppStore[pCube->nLits], pThis )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find a containing cube
    for ( i = 0; i < (int)pCube->nLits; i++ )
    Min_CoverForEachCube( p->ppStore[i], pThis )
    {
        if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find distance one in the same bin
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, NULL ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransformOr( pCube, pThis );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }

    // clean the other cubes using this one
    for ( i = pCube->nLits + 1; i <= (int)pCube->nVars; i++ )
    {
        ppPrev = &p->ppStore[i];
        Min_CoverForEachCubeSafe( p->ppStore[i], pThis, pThis2 )
        {
            if ( pThis != p->pBubble && Min_CubeIsContained( pCube, pThis ) )
            {
                *ppPrev = pThis->pNext;
                Min_CubeRecycle( p, pThis );
                p->nCubes--;
            }
            else
                ppPrev = &pThis->pNext;
        }
    }

    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}